

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OpenDDLParserTest.cpp
# Opt level: O0

void __thiscall
ODDLParser::OpenDDLParserTest_parsePrimitiveArrayHexTest_Test::
~OpenDDLParserTest_parsePrimitiveArrayHexTest_Test
          (OpenDDLParserTest_parsePrimitiveArrayHexTest_Test *this)

{
  OpenDDLParserTest_parsePrimitiveArrayHexTest_Test *this_local;
  
  ~OpenDDLParserTest_parsePrimitiveArrayHexTest_Test(this);
  operator_delete(this,0x40);
  return;
}

Assistant:

TEST_F(OpenDDLParserTest, parsePrimitiveArrayHexTest) {
    size_t len(0);
    char token[] =
            "{0x01,0x02,0x03}\n";
    char *end(findEnd(token, len));
    Value *data(nullptr);
    Reference *refs(nullptr);
    size_t numRefs(0), numValues(0);
    Value::ValueType type(Value::ValueType::ddl_none);
    char *in = OpenDDLParser::parseDataList(token, end, type, &data, numValues, &refs, numRefs);
    EXPECT_NE(in, token);
    registerValueForDeletion(data);
}